

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastShiftRightInt
               (Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
               Vec_Int_t *vRes)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  byte bVar4;
  int local_4c;
  int local_44;
  int fShort;
  int j;
  int i;
  int Fill;
  int *pRes;
  int fSticky_local;
  int nShift_local;
  int *pShift_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  piVar3 = Wlc_VecCopy(vRes,pNum,nNum);
  if (fSticky == 0) {
    local_4c = 0;
  }
  else {
    local_4c = pNum[nNum + -1];
  }
  bVar1 = false;
  if (0x20 < nShift) {
    __assert_fail("nShift <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x81,
                  "void Wlc_BlastShiftRightInt(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)"
                 );
  }
  for (fShort = 0; fShort < nShift; fShort = fShort + 1) {
    for (local_44 = 0; local_44 < nNum - fSticky; local_44 = local_44 + 1) {
      bVar4 = (byte)fShort;
      if ((bVar1) || (nNum <= local_44 + (1 << (bVar4 & 0x1f)))) {
        iVar2 = Gia_ManHashMux(pNew,pShift[fShort],local_4c,piVar3[local_44]);
        piVar3[local_44] = iVar2;
        if (nNum < 1 << (bVar4 & 0x1f)) {
          bVar1 = true;
        }
      }
      else {
        iVar2 = Gia_ManHashMux(pNew,pShift[fShort],piVar3[local_44 + (1 << (bVar4 & 0x1f))],
                               piVar3[local_44]);
        piVar3[local_44] = iVar2;
      }
    }
  }
  return;
}

Assistant:

void Wlc_BlastShiftRightInt( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[nNum-1] : 0;
    int i, j, fShort = 0;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = 0; j < nNum - fSticky; j++ ) 
        {
            if( fShort || j + (1<<i) >= nNum ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j+(1<<i)], pRes[j] );
        }
}